

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O0

void test_case_signed_div(zt_unit_test *test,void *data)

{
  char cVar1;
  short sVar2;
  int iVar3;
  zt_unit_test *in_RDI;
  char *msg_26;
  char *msg_25;
  char *msg_24;
  char *msg_23;
  char *msg_22;
  char *msg_21;
  char *msg_20;
  char *msg_19;
  char *msg_18;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  
  cVar1 = zt_char_div('\x01','\x7f');
  if (cVar1 != '\0') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(1, CHAR_MAX) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x195);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div('\x7f','\x01');
  if (cVar1 != '\x7f') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(CHAR_MAX, 1) == CHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x196);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div('\x01',-0x80);
  if (cVar1 != '\0') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(1, CHAR_MIN) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x198);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div(-0x80,'\x01');
  if (cVar1 != -0x80) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(CHAR_MIN, 1) == CHAR_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x199);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div('\0',-0x80);
  if (cVar1 != '\0') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(0, CHAR_MIN) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x19b);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div('\x7f','\x02');
  if (cVar1 != '?') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(CHAR_MAX, 2) == CHAR_MAX / 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x19e);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div('\x02','\x7f');
  if (cVar1 != '\0') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(2, CHAR_MAX) == 2 / CHAR_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x19f);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div(-0x80,'\x02');
  if (cVar1 != -0x40) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(CHAR_MIN, 2) == CHAR_MIN / 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1a1);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  cVar1 = zt_char_div('\x02',-0x80);
  if (cVar1 != '\0') {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_char_div(2, CHAR_MIN) == 2 / CHAR_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1a2);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_div(1,0x7fff);
  if (sVar2 != 0) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_div(1, SHORT_MAX) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1a7);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_div(0x7fff,1);
  if (sVar2 != 0x7fff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_div(SHORT_MAX, 1) == SHORT_MAX",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1a8);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_div(1,-0x8000);
  if (sVar2 != 0) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_div(1, SHORT_MIN) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1aa);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_div(-0x8000,1);
  if (sVar2 != -0x8000) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_div(SHORT_MIN, 1) == SHORT_MIN",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1ab);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_div(0,-0x8000);
  if (sVar2 != 0) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_div(0, SHORT_MIN) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1ad);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_div(0x7fff,2);
  if (sVar2 != 0x3fff) {
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_div(SHORT_MAX, 2) == SHORT_MAX / 2"
                           ,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1b0);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar2 = zt_short_div(2,0x7fff);
  if (sVar2 == 0) {
    zt_unit_test_add_assertion(in_RDI);
    sVar2 = zt_short_div(-0x8000,2);
    if (sVar2 != -0x4000) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                             "zt_short_div(SHORT_MIN, 2) == SHORT_MIN / 2",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1b3);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    sVar2 = zt_short_div(2,-0x8000);
    if (sVar2 != 0) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                             "zt_short_div(2, SHORT_MIN) == 2 / SHORT_MIN",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1b4);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_div(1,0x7fffffff);
    if (iVar3 != 0) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(1, INT_MAX) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1b9);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_div(0x7fffffff,1);
    if (iVar3 != 0x7fffffff) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(INT_MAX, 1) == INT_MAX",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1ba);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_div(1,-0x80000000);
    if (iVar3 != 0) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(1, INT_MIN) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1bc);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_div(-0x80000000,1);
    if (iVar3 != -0x80000000) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(INT_MIN, 1) == INT_MIN",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1bd);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_div(0,-0x80000000);
    if (iVar3 != 0) {
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(0, INT_MIN) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1bf);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar3 = zt_int_div(0x7fffffff,2);
    if (iVar3 == 0x3fffffff) {
      zt_unit_test_add_assertion(in_RDI);
      iVar3 = zt_int_div(2,0x7fffffff);
      if (iVar3 != 0) {
        iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(2, INT_MAX) == 2 / INT_MAX",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                               ,0x1c3);
        if (iVar3 == 0) {
          in_RDI->error = (char *)0x0;
        }
        longjmp((__jmp_buf_tag *)in_RDI->env,1);
      }
      zt_unit_test_add_assertion(in_RDI);
      iVar3 = zt_int_div(-0x80000000,2);
      if (iVar3 == -0x40000000) {
        zt_unit_test_add_assertion(in_RDI);
        iVar3 = zt_int_div(2,-0x80000000);
        if (iVar3 == 0) {
          zt_unit_test_add_assertion(in_RDI);
          return;
        }
        iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(2, INT_MIN) == 2 / INT_MIN",
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                               ,0x1c6);
        if (iVar3 == 0) {
          in_RDI->error = (char *)0x0;
        }
        longjmp((__jmp_buf_tag *)in_RDI->env,1);
      }
      iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(INT_MIN, 2) == INT_MIN / 2",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                             ,0x1c5);
      if (iVar3 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_int_div(INT_MAX, 2) == INT_MAX / 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                           ,0x1c2);
    if (iVar3 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar3 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_short_div(2, SHORT_MAX) == 2 / SHORT_MAX",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/int_test.c"
                         ,0x1b1);
  if (iVar3 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void
test_case_signed_div(struct zt_unit_test *test, void *data UNUSED)
{
    /* division */
    /* char */
    ZT_UNIT_ASSERT(test, zt_char_div(1, CHAR_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MAX, 1) == CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_char_div(1, CHAR_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MIN, 1) == CHAR_MIN);

    ZT_UNIT_ASSERT(test, zt_char_div(0, CHAR_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_char_div(CHAR_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MAX, 2) == CHAR_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_char_div(2, CHAR_MAX) == 2 / CHAR_MAX);

    ZT_UNIT_ASSERT(test, zt_char_div(CHAR_MIN, 2) == CHAR_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_char_div(2, CHAR_MIN) == 2 / CHAR_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_char_div(CHAR_MIN, -1)); */

    /* short */
    ZT_UNIT_ASSERT(test, zt_short_div(1, SHORT_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MAX, 1) == SHORT_MAX);

    ZT_UNIT_ASSERT(test, zt_short_div(1, SHORT_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MIN, 1) == SHORT_MIN);

    ZT_UNIT_ASSERT(test, zt_short_div(0, SHORT_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_short_div(SHORT_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MAX, 2) == SHORT_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_short_div(2, SHORT_MAX) == 2 / SHORT_MAX);

    ZT_UNIT_ASSERT(test, zt_short_div(SHORT_MIN, 2) == SHORT_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_short_div(2, SHORT_MIN) == 2 / SHORT_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_short_div(SHORT_MIN, -1)); */

    /* int */
    ZT_UNIT_ASSERT(test, zt_int_div(1, INT_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_int_div(INT_MAX, 1) == INT_MAX);

    ZT_UNIT_ASSERT(test, zt_int_div(1, INT_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_int_div(INT_MIN, 1) == INT_MIN);

    ZT_UNIT_ASSERT(test, zt_int_div(0, INT_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_int_div(INT_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_int_div(INT_MAX, 2) == INT_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_int_div(2, INT_MAX) == 2 / INT_MAX);

    ZT_UNIT_ASSERT(test, zt_int_div(INT_MIN, 2) == INT_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_int_div(2, INT_MIN) == 2 / INT_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_int_div(INT_MIN, -1)); */

# ifndef __x86_64__
    /* long */
    ZT_UNIT_ASSERT(test, zt_long_div(1, LONG_MAX) == 0);
    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MAX, 1) == LONG_MAX);

    ZT_UNIT_ASSERT(test, zt_long_div(1, LONG_MIN) == 0);
    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MIN, 1) == LONG_MIN);

    ZT_UNIT_ASSERT(test, zt_long_div(0, LONG_MIN) == 0);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.divide_by_zero, zt_long_div(LONG_MAX, 0)); */

    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MAX, 2) == LONG_MAX / 2);
    ZT_UNIT_ASSERT(test, zt_long_div(2, LONG_MAX) == 2 / LONG_MAX);

    ZT_UNIT_ASSERT(test, zt_long_div(LONG_MIN, 2) == LONG_MIN / 2);
    ZT_UNIT_ASSERT(test, zt_long_div(2, LONG_MIN) == 2 / LONG_MIN);

    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_long_div(LONG_MIN, -1)); */
# endif /* ifndef __x86_64__ */
}